

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview_p.h
# Opt level: O2

bool __thiscall QHeaderViewPrivate::rowIntersectsSelection(QHeaderViewPrivate *this,int row)

{
  QPointer<QItemSelectionModel> *this_00;
  Data *pDVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  long in_FS_OFFSET;
  QModelIndex local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->super_QAbstractItemViewPrivate).selectionModel;
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (bVar2) {
    pDVar1 = (this_00->wp).d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      iVar4 = 0;
    }
    else {
      iVar4 = (int)(this->super_QAbstractItemViewPrivate).selectionModel.wp.value;
    }
    QPersistentModelIndex::operator_cast_to_QModelIndex
              (&local_40,&(this->super_QAbstractItemViewPrivate).root);
    uVar3 = QItemSelectionModel::rowIntersectsSelection(iVar4,(QModelIndex *)(ulong)(uint)row);
  }
  else {
    uVar3 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (bool)uVar3;
  }
  __stack_chk_fail();
}

Assistant:

inline bool rowIntersectsSelection(int row) const {
        return (selectionModel ? selectionModel->rowIntersectsSelection(row, root) : false);
    }